

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  GetterXsYs<double> *pGVar7;
  TransformerLogLog *pTVar8;
  ImPlotPlot *pIVar9;
  GetterXsYRef<double> *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  int iVar19;
  long lVar20;
  ushort uVar21;
  ImDrawIdx IVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar46 [16];
  
  pIVar17 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar19 = pGVar7->Count;
  lVar20 = (long)(((pGVar7->Offset + prim + 1) % iVar19 + iVar19) % iVar19) * (long)pGVar7->Stride;
  dVar1 = *(double *)((long)pGVar7->Ys + lVar20);
  dVar13 = log10(*(double *)((long)pGVar7->Xs + lVar20) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar9->XAxis).Range.Min;
  dVar4 = (pIVar9->XAxis).Range.Max;
  dVar1 = log10(dVar1 / pIVar9->YAxis[pTVar8->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar19 = pTVar8->YAxis;
  pIVar9 = pIVar17->CurrentPlot;
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar6 = pGVar10->Count;
  auVar38._8_8_ = dVar1;
  auVar38._0_8_ = dVar13;
  dVar1 = pGVar10->YRef;
  auVar14._8_4_ = SUB84(pIVar17->LogDenY[iVar19],0);
  auVar14._0_8_ = dVar2;
  auVar14._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar19] >> 0x20);
  auVar39 = divpd(auVar38,auVar14);
  dVar2 = pIVar9->YAxis[iVar19].Range.Min;
  IVar5 = pIVar17->PixelRange[iVar19].Min;
  fVar28 = (float)(pIVar17->Mx *
                   (((double)(float)auVar39._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar5.x);
  fVar30 = (float)(pIVar17->My[iVar19] *
                   (((double)(float)auVar39._8_8_ * (pIVar9->YAxis[iVar19].Range.Max - dVar2) +
                    dVar2) - dVar2) + (double)IVar5.y);
  dVar13 = log10(*(double *)
                  ((long)pGVar10->Xs +
                  (long)(((prim + 1 + pGVar10->Offset) % iVar6 + iVar6) % iVar6) *
                  (long)pGVar10->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar18->CurrentPlot;
  dVar2 = pIVar18->LogDenX;
  dVar3 = (pIVar9->XAxis).Range.Min;
  dVar4 = (pIVar9->XAxis).Range.Max;
  dVar1 = log10(dVar1 / pIVar9->YAxis[pTVar8->YAxis].Range.Min);
  iVar19 = pTVar8->YAxis;
  auVar32._8_8_ = dVar1;
  auVar32._0_8_ = dVar13;
  auVar39._8_4_ = SUB84(pIVar18->LogDenY[iVar19],0);
  auVar39._0_8_ = dVar2;
  auVar39._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar19] >> 0x20);
  auVar39 = divpd(auVar32,auVar39);
  pIVar9 = pIVar18->CurrentPlot;
  dVar1 = pIVar9->YAxis[iVar19].Range.Min;
  IVar5 = pIVar18->PixelRange[iVar19].Min;
  fVar29 = (float)(pIVar18->Mx *
                   (((double)(float)auVar39._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar5.x);
  fVar31 = (float)(pIVar18->My[iVar19] *
                   (((double)(float)auVar39._8_8_ * (pIVar9->YAxis[iVar19].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar5.y);
  fVar15 = (this->P12).x;
  fVar33 = (this->P12).y;
  fVar35 = (this->P11).x;
  fVar36 = (this->P11).y;
  uVar26 = -(uint)(fVar36 < fVar33);
  fVar34 = (float)(~-(uint)(fVar15 <= fVar35) & (uint)fVar15 |
                  (uint)fVar35 & -(uint)(fVar15 <= fVar35));
  fVar37 = (float)(~-(uint)(fVar33 <= fVar36) & (uint)fVar33 |
                  (uint)fVar36 & -(uint)(fVar33 <= fVar36));
  fVar41 = (float)(~-(uint)(fVar35 < fVar15) & (uint)fVar15 |
                  (uint)fVar35 & -(uint)(fVar35 < fVar15));
  fVar50 = (float)(~uVar26 & (uint)fVar33 | (uint)fVar36 & uVar26);
  uVar23 = -(uint)(fVar28 <= fVar34);
  uVar24 = -(uint)(fVar30 <= fVar37);
  uVar25 = -(uint)(fVar41 < fVar28);
  uVar27 = -(uint)(fVar50 < fVar30);
  fVar34 = (float)(~uVar23 & (uint)fVar28 | (uint)fVar34 & uVar23);
  fVar37 = (float)(~uVar24 & (uint)fVar30 | (uint)fVar37 & uVar24);
  fVar41 = (float)(~uVar25 & (uint)fVar28 | (uint)fVar41 & uVar25);
  fVar50 = (float)(~uVar27 & (uint)fVar30 | (uint)fVar50 & uVar27);
  uVar23 = -(uint)(fVar29 <= fVar34);
  uVar24 = -(uint)(fVar31 <= fVar37);
  uVar25 = -(uint)(fVar41 < fVar29);
  uVar27 = -(uint)(fVar50 < fVar31);
  auVar42._0_4_ = (uint)fVar34 & uVar23;
  auVar42._4_4_ = (uint)fVar37 & uVar24;
  auVar42._8_4_ = (uint)fVar41 & uVar25;
  auVar42._12_4_ = (uint)fVar50 & uVar27;
  auVar47._0_4_ = ~uVar23 & (uint)fVar29;
  auVar47._4_4_ = ~uVar24 & (uint)fVar31;
  auVar47._8_4_ = ~uVar25 & (uint)fVar29;
  auVar47._12_4_ = ~uVar27 & (uint)fVar31;
  auVar47 = auVar47 | auVar42;
  fVar34 = (cull_rect->Min).y;
  auVar49._4_4_ = -(uint)(fVar34 < auVar47._4_4_);
  auVar49._0_4_ = -(uint)((cull_rect->Min).x < auVar47._0_4_);
  auVar16._4_8_ = auVar47._8_8_;
  auVar16._0_4_ = -(uint)(auVar47._4_4_ < fVar34);
  auVar48._0_8_ = auVar16._0_8_ << 0x20;
  auVar48._8_4_ = -(uint)(auVar47._8_4_ < (cull_rect->Max).x);
  auVar48._12_4_ = -(uint)(auVar47._12_4_ < (cull_rect->Max).y);
  auVar49._8_8_ = auVar48._8_8_;
  iVar19 = movmskps((int)cull_rect,auVar49);
  if (iVar19 == 0xf) {
    fVar37 = fVar30 * fVar35 - fVar36 * fVar28;
    fVar41 = fVar31 * fVar15 - fVar33 * fVar29;
    fVar34 = fVar33 - fVar31;
    auVar43._4_4_ = fVar34;
    auVar43._0_4_ = fVar34;
    auVar43._8_4_ = fVar34;
    auVar43._12_4_ = fVar34;
    auVar44._4_12_ = auVar43._4_12_;
    auVar44._0_4_ = fVar34 * (fVar35 - fVar28) - (fVar36 - fVar30) * (fVar15 - fVar29);
    auVar40._0_4_ = fVar37 * (fVar15 - fVar29) - fVar41 * (fVar35 - fVar28);
    auVar40._4_4_ = fVar37 * fVar34 - fVar41 * (fVar36 - fVar30);
    auVar40._8_4_ = fVar30 * 0.0 - fVar31 * 0.0;
    auVar40._12_4_ = fVar30 * 0.0 - fVar31 * 0.0;
    auVar46._0_8_ = auVar44._0_8_;
    auVar46._8_4_ = fVar34;
    auVar46._12_4_ = fVar34;
    auVar45._8_8_ = auVar46._8_8_;
    auVar45._4_4_ = auVar44._0_4_;
    auVar45._0_4_ = auVar44._0_4_;
    auVar39 = divps(auVar40,auVar45);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = this->Col;
    pIVar11[1].pos.x = fVar28;
    pIVar11[1].pos.y = fVar30;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = this->Col;
    pIVar11[2].pos = auVar39._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = this->Col;
    pIVar11[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = this->Col;
    IVar5.y = fVar31;
    IVar5.x = fVar29;
    pIVar11[4].pos = IVar5;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar11 + 5;
    uVar23 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar22 = (ImDrawIdx)uVar23;
    *pIVar12 = IVar22;
    uVar21 = (byte)((byte)uVar26 & fVar31 < fVar30 | -(fVar33 < fVar36) & -(fVar30 < fVar31)) & 1;
    pIVar12[1] = IVar22 + uVar21 + 1;
    pIVar12[2] = IVar22 + 3;
    pIVar12[3] = IVar22 + 1;
    pIVar12[4] = (uVar21 ^ 3) + IVar22;
    pIVar12[5] = IVar22 + 4;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar23 + 5;
  }
  (this->P11).x = fVar28;
  (this->P11).y = fVar30;
  (this->P12).x = fVar29;
  (this->P12).y = fVar31;
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }